

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::AtomicCounterIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,AtomicCounterIndexingCaseInstance *this)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  long lVar4;
  ulong *puVar5;
  undefined8 uVar6;
  AtomicCounterIndexingCaseInstance *pAVar7;
  undefined1 auVar8 [8];
  vector<bool,_std::allocator<bool>_> *__cur;
  DeviceInterface *vk;
  VkDevice pVVar9;
  pointer piVar10;
  ShaderExecutor *pSVar11;
  int *piVar12;
  long lVar13;
  InternalError *this_00;
  undefined8 *puVar14;
  int opNdx;
  long lVar15;
  void *pvVar16;
  int opNdx_1;
  ulong *puVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  uint *puVar21;
  VkDescriptorBufferInfo bufferInfo;
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  value_type_conflict1 *__val;
  Move<vk::Handle<(vk::HandleType)22>_> extraResourcesSet;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  Move<vk::Handle<(vk::HandleType)19>_> extraResourcesLayout;
  vector<void_*,_std::allocator<void_*>_> outputs;
  VkDescriptorPoolSize poolSizes [2];
  Move<vk::Handle<(vk::HandleType)21>_> extraResourcesSetPool;
  Buffer atomicOpBuffer;
  VkDescriptorSetLayoutBinding bindings [2];
  VkDescriptorPoolSize local_378;
  pointer pvStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  TestStatus *local_350;
  undefined1 local_348 [16];
  undefined8 local_338;
  VkDescriptorPool VStack_330;
  int *local_320;
  undefined8 *local_318;
  uint *local_310;
  VkDescriptorPoolSize local_308;
  pointer pvStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  string *local_2e8;
  AtomicCounterIndexingCaseInstance *local_2e0;
  void *local_2d8;
  void *pvStack_2d0;
  long local_2c8;
  vector<int,_std::allocator<int>_> local_2b8;
  VkDescriptorPoolSize local_2a0;
  UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  local_298;
  VkDescriptorPoolSize local_288;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_280;
  void *local_268;
  undefined8 uStack_260;
  long local_258;
  VkDescriptorPoolSize local_248;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_240;
  VkDescriptorPoolSize local_228;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  uint *local_200;
  Buffer local_1f8;
  undefined1 local_1b8 [8];
  VkDescriptorPoolSize *pVStack_1b0;
  VkDescriptorPoolSize local_1a8;
  VkDescriptorPoolSize VStack_1a0;
  VkDescriptorPoolSize *local_198;
  undefined8 uStack_190;
  undefined1 *local_188;
  undefined8 local_180;
  ios_base local_140 [272];
  
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2c8 = 0;
  local_2d8 = (void *)0x0;
  pvStack_2d0 = (void *)0x0;
  local_258 = 0;
  local_268 = (void *)0x0;
  uStack_260 = 0;
  local_350 = __return_storage_ptr__;
  local_310 = (uint *)operator_new(0x200);
  memset(local_310,0,0x200);
  vk = Context::getDeviceInterface
                 ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  pVVar9 = Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                              m_context);
  anon_unknown_0::Buffer::Buffer
            (&local_1f8,(this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
             0x20,0x10);
  local_298.m_data.ptr = (Buffer *)0x0;
  DStack_280.m_device = (VkDevice)0x0;
  DStack_280.m_allocator = (VkAllocationCallbacks *)0x0;
  local_288.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_288.descriptorCount = 0;
  DStack_280.m_deviceIface = (DeviceInterface *)0x0;
  DStack_220.m_device = (VkDevice)0x0;
  DStack_220.m_allocator = (VkAllocationCallbacks *)0x0;
  local_228.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_228.descriptorCount = 0;
  DStack_220.m_deviceIface = (DeviceInterface *)0x0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_308.descriptorCount = 0;
  pvStack_300 = (pointer)0x0;
  OpaqueTypeIndexingTestInstance::checkSupported
            (&this->super_OpaqueTypeIndexingTestInstance,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
  puVar14 = (undefined8 *)
            (local_1f8.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr;
  *puVar14 = 0;
  puVar14[1] = 0;
  piVar12 = (int *)(local_1f8.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset;
  ::vk::flushMappedMemoryRange
            (local_1f8.m_vkd,local_1f8.m_device,
             (VkDeviceMemory)
             ((local_1f8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,(VkDeviceSize)piVar12,0xffffffffffffffff);
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    createUniformIndexBuffer
              ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)local_1b8,
               (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
               (int)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start,piVar12);
    auVar8 = local_1b8;
    local_1b8 = (undefined1  [8])0x0;
    if (auVar8 != (undefined1  [8])0x0) {
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset(&local_298);
      local_298.m_data.ptr = (Buffer *)auVar8;
    }
    de::details::
    UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::reset((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             *)local_1b8);
  }
  VStack_330.m_internal = (deUint64)local_1b8;
  local_198 = (VkDescriptorPoolSize *)0x7fffffff00000001;
  uStack_190 = 0;
  local_1a8.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_1a8.descriptorCount = 0;
  VStack_1a0.type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  VStack_1a0.descriptorCount = 6;
  local_1b8 = (undefined1  [8])0x700000000;
  pVStack_1b0 = (VkDescriptorPoolSize *)0x7fffffff00000001;
  local_348._0_4_ = 0x20;
  local_348._8_8_ = (pointer)0x0;
  local_338 = (VkDevice)0x200000000;
  ::vk::createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_248,vk,pVVar9,
             (VkDescriptorSetLayoutCreateInfo *)local_348,(VkAllocationCallbacks *)0x0);
  local_368 = DStack_240.m_device;
  uStack_360 = DStack_240.m_allocator;
  local_378 = local_248;
  pvStack_370 = (pointer)DStack_240.m_deviceIface;
  local_248.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_248.descriptorCount = 0;
  DStack_240.m_deviceIface = (DeviceInterface *)0x0;
  DStack_240.m_device = (VkDevice)0x0;
  DStack_240.m_allocator = (VkAllocationCallbacks *)0x0;
  if (local_288 != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_280,(VkDescriptorSetLayout)local_288);
  }
  DStack_280.m_device = local_368;
  DStack_280.m_allocator = uStack_360;
  local_288 = local_378;
  DStack_280.m_deviceIface = (DeviceInterface *)pvStack_370;
  if (local_248 != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_240,(VkDescriptorSetLayout)local_248);
  }
  local_248.type = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_248.descriptorCount = 1;
  DStack_240.m_deviceIface = (DeviceInterface *)0x100000006;
  local_1b8._0_4_ = 0x21;
  pVStack_1b0 = (VkDescriptorPoolSize *)0x0;
  local_1a8.type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  local_1a8.descriptorCount = 1;
  VStack_1a0.type = VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE;
  local_198 = &local_248;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_348,vk,pVVar9,
             (VkDescriptorPoolCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  local_368 = local_338;
  uStack_360 = (VkAllocationCallbacks *)VStack_330.m_internal;
  local_378.type = local_348._0_4_;
  local_378.descriptorCount = local_348._4_4_;
  pvStack_370 = (pointer)local_348._8_8_;
  local_348._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_348._4_4_ = 0;
  local_348._8_8_ = (pointer)0x0;
  local_338 = (VkDevice)0x0;
  VStack_330.m_internal = 0;
  if (local_228 != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&DStack_220,(VkDescriptorPool)local_228);
  }
  DStack_220.m_device = local_368;
  DStack_220.m_allocator = uStack_360;
  local_228 = local_378;
  DStack_220.m_deviceIface = (DeviceInterface *)pvStack_370;
  if ((VkDescriptorPoolSize)local_348._0_8_ != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_348 + 8),
               (VkDescriptorPool)local_348._0_8_);
  }
  local_1b8._0_4_ = 0x22;
  pVStack_1b0 = (VkDescriptorPoolSize *)0x0;
  local_1a8 = local_228;
  VStack_1a0.type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  local_198 = &local_288;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_348,vk,pVVar9,
             (VkDescriptorSetAllocateInfo *)local_1b8);
  local_368._0_4_ = (VkDescriptorSetLayoutCreateFlags)local_338;
  local_368._4_4_ = local_338._4_4_;
  uStack_360._0_4_ = (undefined4)VStack_330.m_internal;
  uStack_360._4_4_ = VStack_330.m_internal._4_4_;
  local_378.type = local_348._0_4_;
  local_378.descriptorCount = local_348._4_4_;
  pvStack_370 = (pointer)local_348._8_8_;
  local_348._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_348._4_4_ = 0;
  local_348._8_8_ = (pointer)0x0;
  local_338 = (VkDevice)0x0;
  VStack_330.m_internal = 0;
  if (local_308 != (VkDescriptorPoolSize)0x0) {
    local_248 = local_308;
    (**(code **)(*(long *)pvStack_300 + 0x1e8))(pvStack_300,local_2f8,uStack_2f0,1);
  }
  local_2f8 = CONCAT44(local_368._4_4_,(VkDescriptorSetLayoutCreateFlags)local_368);
  uStack_2f0 = CONCAT44(uStack_360._4_4_,(undefined4)uStack_360);
  local_308 = local_378;
  pvStack_300 = pvStack_370;
  if ((VkDescriptorPoolSize)local_348._0_8_ != (VkDescriptorPoolSize)0x0) {
    local_378.type = local_348._0_4_;
    local_378.descriptorCount = local_348._4_4_;
    (*(_func_int *)
      (((_Bvector_base<std::allocator<bool>_> *)local_348._8_8_)->_M_impl).super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p[0x3d])
              (local_348._8_8_,local_338,VStack_330.m_internal,1);
  }
  local_378.type =
       (undefined4)
       local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_378.descriptorCount =
       local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
       _4_4_;
  pvStack_370 = (pointer)0x0;
  local_368 = (VkDevice)0xffffffffffffffff;
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  pVStack_1b0 = (VkDescriptorPoolSize *)0x0;
  local_1a8 = local_308;
  VStack_1a0.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  VStack_1a0.descriptorCount = 0;
  local_198 = (VkDescriptorPoolSize *)0x700000001;
  uStack_190 = 0;
  local_180 = 0;
  local_188 = (undefined1 *)&local_378;
  (*vk->_vptr_DeviceInterface[0x3e])(vk,pVVar9,1,local_1b8,0,0);
  if (local_298.m_data.ptr != (Buffer *)0x0) {
    local_378 = (VkDescriptorPoolSize)
                ((local_298.m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                m_data.object.m_internal;
    pvStack_370 = (pointer)0x0;
    local_368 = (VkDevice)0xffffffffffffffff;
    local_1b8._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
    pVStack_1b0 = (VkDescriptorPoolSize *)0x0;
    local_1a8 = local_308;
    VStack_1a0 = (VkDescriptorPoolSize)&DAT_00000001;
    local_198 = (VkDescriptorPoolSize *)0x600000001;
    uStack_190 = 0;
    local_180 = 0;
    local_188 = (undefined1 *)&local_378;
    (*vk->_vptr_DeviceInterface[0x3e])(vk,pVVar9,1,local_1b8,0,0);
  }
  local_2e0 = this;
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
      INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    std::vector<int,_std::allocator<int>_>::resize
              (&local_2b8,
               ((long)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start) * 8);
    piVar3 = (this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 0;
    piVar10 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar1 = piVar3[lVar15];
      lVar18 = 0;
      do {
        *(int *)((long)piVar10 + lVar18) = iVar1;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x80);
      lVar15 = lVar15 + 1;
      piVar10 = piVar10 + 0x20;
    } while (lVar15 != 4);
    lVar15 = 0;
    do {
      local_1b8 = (undefined1  [8])
                  ((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar15);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&local_2d8,(void **)local_1b8);
      lVar15 = lVar15 + 0x80;
    } while (lVar15 != 0x200);
  }
  lVar15 = 0;
  do {
    local_1b8 = (undefined1  [8])((long)local_310 + lVar15);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&local_268,(void **)local_1b8);
    pAVar7 = local_2e0;
    lVar15 = lVar15 + 0x80;
  } while (lVar15 != 0x200);
  pSVar11 = createExecutor((local_2e0->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                           m_context,(local_2e0->super_OpaqueTypeIndexingTestInstance).m_shaderType,
                           (local_2e0->super_OpaqueTypeIndexingTestInstance).m_shaderSpec,
                           (VkDescriptorSetLayout)local_288);
  pvVar16 = (void *)0x0;
  if (local_2d8 != pvStack_2d0) {
    pvVar16 = local_2d8;
  }
  (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,0x20,pvVar16,local_268,local_308);
  (*pSVar11->_vptr_ShaderExecutor[1])(pSVar11);
  local_2a0 = (VkDescriptorPoolSize)
              ((pAVar7->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context)->
              m_testCtx->m_log;
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
  local_350->m_code = QP_TEST_RESULT_PASS;
  local_2e8 = (string *)&local_350->m_description;
  local_208 = &(local_350->m_description).field_2;
  (local_350->m_description)._M_dataplus._M_p = (pointer)local_208;
  std::__cxx11::string::_M_construct<char*>
            (local_2e8,local_1b8,(long)&pVStack_1b0->type + (long)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)local_1a8 + 1));
  }
  local_320 = (int *)operator_new(0x10);
  local_320[0] = 0;
  local_320[1] = 0;
  local_320[2] = 0;
  local_320[3] = 0;
  local_318 = (undefined8 *)operator_new(0x10);
  *local_318 = 0;
  local_318[1] = 0;
  local_348._0_8_ = 0;
  local_348._8_8_ = (pointer)0x0;
  local_338 = (VkDevice)0x0;
  local_348._0_8_ = operator_new(0xa0);
  pVVar9 = (VkDevice)(local_348._0_8_ + 0xa0);
  lVar15 = 0;
  local_348._8_8_ = local_348._0_8_;
  local_338 = pVVar9;
  memset((void *)local_348._0_8_,0,0xa0);
  piVar3 = (pAVar7->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    local_320[piVar3[lVar15]] = local_320[piVar3[lVar15]] + 1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  puVar14 = (undefined8 *)
            (local_1f8.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr;
  local_348._8_8_ = pVVar9;
  ::vk::invalidateMappedMemoryRange
            (local_1f8.m_vkd,local_1f8.m_device,
             (VkDeviceMemory)
             ((local_1f8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_1f8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,0xffffffffffffffff);
  uVar6 = puVar14[1];
  *local_318 = *puVar14;
  local_318[1] = uVar6;
  lVar15 = 0;
  piVar12 = local_320;
  puVar14 = local_318;
  do {
    if (piVar12[lVar15] << 5 != *(int *)((long)puVar14 + lVar15 * 4)) {
      local_1b8._0_4_ = local_2a0.type;
      local_1b8._4_4_ = local_2a0.descriptorCount;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pVStack_1b0,"ERROR: atomic counter ",0x16);
      std::ostream::operator<<((ostringstream *)&pVStack_1b0,(int)lVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0," has value ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,", expected ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_1b0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_1b0);
      std::ios_base::~ios_base(local_140);
      piVar12 = local_320;
      puVar14 = local_318;
      if (local_350->m_code == QP_TEST_RESULT_PASS) {
        local_378 = (VkDescriptorPoolSize)&local_368;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_378,"Invalid atomic counter value","");
        local_1b8._0_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
        pVStack_1b0 = &VStack_1a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pVStack_1b0,local_378,(long)pvStack_370 + (long)local_378);
        local_350->m_code = local_1b8._0_4_;
        std::__cxx11::string::operator=(local_2e8,(string *)&pVStack_1b0);
        if (pVStack_1b0 != &VStack_1a0) {
          operator_delete(pVStack_1b0,(ulong)((long)VStack_1a0 + 1));
        }
        piVar12 = local_320;
        puVar14 = local_318;
        if (local_378 != (VkDescriptorPoolSize)&local_368) {
          operator_delete((void *)local_378,(long)local_368 + 1);
          piVar12 = local_320;
          puVar14 = local_318;
        }
      }
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  lVar15 = 0;
  do {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(local_348._0_8_ + lVar15),
               (long)(*piVar12 << 5),false);
    piVar12 = piVar12 + 1;
    lVar15 = lVar15 + 0x28;
  } while (lVar15 != 0xa0);
  lVar15 = 0;
  puVar21 = local_310;
  do {
    lVar18 = 0;
    local_200 = puVar21;
    do {
      lVar13 = (long)(local_2e0->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_start[lVar18];
      uVar2 = *puVar21;
      lVar4 = *(long *)(local_348._0_8_ + lVar13 * 0x28);
      if ((uVar2 < (uint)((*(int *)(local_348._0_8_ + 0x10 + lVar13 * 0x28) - (int)lVar4) * 8 +
                         *(int *)(local_348._0_8_ + 0x18 + lVar13 * 0x28))) &&
         ((*(ulong *)(lVar4 + (ulong)(uVar2 >> 6) * 8) >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
        puVar17 = (ulong *)(lVar4 + (ulong)(uVar2 >> 6) * 8);
        *puVar17 = *puVar17 | 1L << ((byte)uVar2 & 0x3f);
      }
      else {
        local_1b8._0_4_ = local_2a0.type;
        local_1b8._4_4_ = local_2a0.descriptorCount;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_1b0,"ERROR: at invocation ",0x15);
        std::ostream::operator<<((ostringstream *)&pVStack_1b0,(int)lVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,", op ",5);
        std::ostream::operator<<((ostringstream *)&pVStack_1b0,(int)lVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_1b0,": got invalid result value ",0x1b);
        std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_1b0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_1b0);
        std::ios_base::~ios_base(local_140);
        if (local_350->m_code == QP_TEST_RESULT_PASS) {
          local_378 = (VkDescriptorPoolSize)&local_368;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,"Invalid result value","");
          local_1b8._0_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
          pVStack_1b0 = &VStack_1a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pVStack_1b0,local_378,(long)pvStack_370 + (long)local_378);
          local_350->m_code = local_1b8._0_4_;
          std::__cxx11::string::operator=(local_2e8,(string *)&pVStack_1b0);
          if (pVStack_1b0 != &VStack_1a0) {
            operator_delete(pVStack_1b0,(ulong)((long)VStack_1a0 + 1));
          }
          if (local_378 != (VkDescriptorPoolSize)&local_368) {
            operator_delete((void *)local_378,(long)local_368 + 1);
          }
        }
      }
      lVar18 = lVar18 + 1;
      puVar21 = puVar21 + 0x20;
    } while (lVar18 != 4);
    lVar15 = lVar15 + 1;
    puVar21 = local_200 + 1;
  } while (lVar15 != 0x20);
  if (local_350->m_code == QP_TEST_RESULT_PASS) {
    lVar15 = 0;
    do {
      puVar17 = *(ulong **)(local_348._0_8_ + lVar15 * 0x28);
      puVar5 = *(ulong **)(local_348._0_8_ + 0x10 + lVar15 * 0x28);
      iVar1 = *(int *)(local_348._0_8_ + 0x18 + lVar15 * 0x28);
      if (iVar1 != 0 || puVar17 != puVar5) {
        uVar20 = 0;
        do {
          if ((*puVar17 >> (uVar20 & 0x3f) & 1) == 0) {
            this_00 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (this_00,(char *)0x0,"*i",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktOpaqueTypeIndexingTests.cpp"
                       ,0x716);
            __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
          }
          iVar19 = (int)uVar20;
          uVar20 = (ulong)(iVar19 + 1);
          if (iVar19 == 0x3f) {
            uVar20 = 0;
          }
          puVar17 = puVar17 + (iVar19 == 0x3f);
        } while ((int)uVar20 != iVar1 || puVar17 != puVar5);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)local_348);
  operator_delete(local_318,0x10);
  operator_delete(local_320,0x10);
  if (local_308 != (VkDescriptorPoolSize)0x0) {
    local_1b8._0_4_ = local_308.type;
    local_1b8._4_4_ = local_308.descriptorCount;
    (*(_func_int *)
      (pvStack_300->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p[0x3d])(pvStack_300,local_2f8,uStack_2f0,1);
  }
  if (local_228 != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&DStack_220,(VkDescriptorPool)local_228);
  }
  if (local_288 != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_280,(VkDescriptorSetLayout)local_288);
  }
  de::details::
  UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  ::reset(&local_298);
  if (local_1f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_1f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_1f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if ((VkDescriptorPoolSize)
      local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  operator_delete(local_310,0x200);
  if (local_268 != (void *)0x0) {
    operator_delete(local_268,local_258 - (long)local_268);
  }
  if (local_2d8 != (void *)0x0) {
    operator_delete(local_2d8,local_2c8 - (long)local_2d8);
  }
  if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_350;
}

Assistant:

tcu::TestStatus AtomicCounterIndexingCaseInstance::iterate (void)
{
	// \todo [2015-12-02 elecro] Add vertexPipelineStoresAndAtomics feature check.
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numCounters			= NUM_COUNTERS;
	const int					numOps				= NUM_OPS;
	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	std::vector<deUint32>		outValues			(numInvocations*numOps);

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	Buffer						atomicOpBuffer		(m_context, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT, sizeof(deUint32)*numCounters);
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);

	deMemset(atomicOpBuffer.getHostPtr(), 0, sizeof(deUint32)*numCounters);
	atomicOpBuffer.flush();

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numOps, &m_opIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,	VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ 1u,	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		const VkDescriptorBufferInfo	bufferInfo			=
		{
			atomicOpBuffer.getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			1u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_opIndices.size());

		for (int opNdx = 0; opNdx < numOps; opNdx++)
		{
			int* dst = &expandedIndices[numInvocations*opNdx];
			std::fill(dst, dst+numInvocations, m_opIndices[opNdx]);
		}

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			inputs.push_back(&expandedIndices[opNdx*numInvocations]);
	}

	for (int opNdx = 0; opNdx < numOps; opNdx++)
		outputs.push_back(&outValues[opNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	{
		tcu::TestLog&					log				= m_context.getTestContext().getLog();
		tcu::TestStatus					testResult		= tcu::TestStatus::pass("Pass");
		std::vector<int>				numHits			(numCounters, 0);	// Number of hits per counter.
		std::vector<deUint32>			counterValues	(numCounters);
		std::vector<std::vector<bool> >	counterMasks	(numCounters);

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			numHits[m_opIndices[opNdx]] += 1;

		// Read counter values
		{
			const void* mapPtr = atomicOpBuffer.getHostPtr();
			DE_ASSERT(mapPtr != DE_NULL);
			atomicOpBuffer.invalidate();
			std::copy((const deUint32*)mapPtr, (const deUint32*)mapPtr + numCounters, &counterValues[0]);
		}

		// Verify counter values
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const deUint32		refCount	= (deUint32)(numHits[counterNdx]*numInvocations);
			const deUint32		resCount	= counterValues[counterNdx];

			if (refCount != resCount)
			{
				log << tcu::TestLog::Message << "ERROR: atomic counter " << counterNdx << " has value " << resCount
					<< ", expected " << refCount
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid atomic counter value");
			}
		}

		// Allocate bitmasks - one bit per each valid result value
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const int	counterValue	= numHits[counterNdx]*numInvocations;
			counterMasks[counterNdx].resize(counterValue, false);
		}

		// Verify result values from shaders
		for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
		{
			for (int opNdx = 0; opNdx < numOps; opNdx++)
			{
				const int		counterNdx	= m_opIndices[opNdx];
				const deUint32	resValue	= outValues[opNdx*numInvocations + invocationNdx];
				const bool		rangeOk		= de::inBounds(resValue, 0u, (deUint32)counterMasks[counterNdx].size());
				const bool		notSeen		= rangeOk && !counterMasks[counterNdx][resValue];
				const bool		isOk		= rangeOk && notSeen;

				if (!isOk)
				{
					log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
						<< ", op " << opNdx << ": got invalid result value "
						<< resValue
						<< tcu::TestLog::EndMessage;

					if (testResult.getCode() == QP_TEST_RESULT_PASS)
						testResult = tcu::TestStatus::fail("Invalid result value");
				}
				else
				{
					// Mark as used - no other invocation should see this value from same counter.
					counterMasks[counterNdx][resValue] = true;
				}
			}
		}

		if (testResult.getCode() == QP_TEST_RESULT_PASS)
		{
			// Consistency check - all masks should be 1 now
			for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
			{
				for (std::vector<bool>::const_iterator i = counterMasks[counterNdx].begin(); i != counterMasks[counterNdx].end(); i++)
					TCU_CHECK_INTERNAL(*i);
			}
		}

		return testResult;
	}
}